

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O2

void http_parser_pause(http_parser *parser,int paused)

{
  uint uVar1;
  
  uVar1 = *(uint *)&parser->field_0x14 >> 0x18 & 0x7f;
  if ((uVar1 != 0x1f) && (uVar1 != 0)) {
    __assert_fail("0 && \"Attempting to pause parser in error state\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatzka[P]cio/lib/cio/http-parser/http_parser.c"
                  ,0x9f5,"void http_parser_pause(http_parser *, int)");
  }
  uVar1 = 0x1f000000;
  if (paused == 0) {
    uVar1 = 0;
  }
  *(uint *)&parser->field_0x14 = *(uint *)&parser->field_0x14 & 0x80ffffff | uVar1;
  return;
}

Assistant:

void
http_parser_pause(http_parser *parser, int paused) {
  /* Users should only be pausing/unpausing a parser that is not in an error
   * state. In non-debug builds, there's not much that we can do about this
   * other than ignore it.
   */
  if (HTTP_PARSER_ERRNO(parser) == HPE_OK ||
      HTTP_PARSER_ERRNO(parser) == HPE_PAUSED) {
    uint32_t nread = parser->nread; /* used by the SET_ERRNO macro */
    SET_ERRNO((paused) ? HPE_PAUSED : HPE_OK);
  } else {
    assert(0 && "Attempting to pause parser in error state");
  }
}